

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::calculateJacobi
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btConstraintInfo2 *info,int srow,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  undefined8 uVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 local_10 [16];
  undefined8 uVar9;
  
  bVar6 = rotational != 0;
  pbVar2 = (&info->m_J1linearAxis)[bVar6];
  pbVar3 = (&info->m_J2linearAxis)[bVar6];
  lVar4 = (long)srow;
  pbVar2[lVar4] = ax1->m_floats[0];
  pbVar2[lVar4 + 1] = ax1->m_floats[1];
  pbVar2[lVar4 + 2] = ax1->m_floats[2];
  pbVar3[lVar4] = -ax1->m_floats[0];
  pbVar3[lVar4 + 1] = -ax1->m_floats[1];
  pbVar3[lVar4 + 2] = -ax1->m_floats[2];
  if (!bVar6) {
    fVar11 = (this->m_calculatedTransformB).m_origin.m_floats[0] - (transB->m_origin).m_floats[0];
    fVar13 = (this->m_calculatedTransformA).m_origin.m_floats[0] - (transA->m_origin).m_floats[0];
    fVar12 = ax1->m_floats[0];
    uVar9 = *(undefined8 *)((this->m_calculatedTransformB).m_origin.m_floats + 1);
    uVar1 = *(undefined8 *)((transB->m_origin).m_floats + 1);
    fVar14 = (float)uVar9 - (float)uVar1;
    fVar15 = (float)((ulong)uVar9 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
    uVar9 = *(undefined8 *)((this->m_calculatedTransformA).m_origin.m_floats + 1);
    uVar1 = *(undefined8 *)((transA->m_origin).m_floats + 1);
    fVar7 = (float)uVar9 - (float)uVar1;
    fVar10 = (float)((ulong)uVar9 >> 0x20) - (float)((ulong)uVar1 >> 0x20);
    fVar16 = (float)*(undefined8 *)(ax1->m_floats + 1);
    fVar17 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
    fVar8 = fVar7 * fVar17 - fVar10 * fVar16;
    fVar10 = fVar10 * fVar12 - fVar13 * fVar17;
    uVar9 = CONCAT44(fVar10,fVar8);
    fVar7 = fVar13 * fVar16 - fVar12 * fVar7;
    fVar13 = fVar17 * fVar14 - fVar15 * fVar16;
    fVar15 = fVar12 * fVar15 - fVar11 * fVar17;
    fVar12 = fVar11 * fVar16 - fVar14 * fVar12;
    local_10._4_4_ = fVar15;
    local_10._0_4_ = fVar13;
    local_10._8_4_ = fVar12;
    local_10._12_4_ = 0;
    if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
      fVar11 = this->m_factA;
      fVar14 = this->m_factB;
      fVar7 = fVar7 * fVar11;
      uVar9 = CONCAT44(fVar10 * fVar11,fVar8 * fVar11);
      local_10._4_4_ = fVar14 * fVar15;
      local_10._0_4_ = fVar14 * fVar13;
      local_10._8_4_ = fVar12 * fVar14;
      local_10._12_4_ = 0;
    }
    pbVar2 = info->m_J1angularAxis;
    *(undefined8 *)(pbVar2 + lVar4) = uVar9;
    pbVar2[lVar4 + 2] = fVar7;
    pbVar2 = info->m_J2angularAxis;
    lVar5 = 0;
    do {
      pbVar2[lVar4 + lVar5] = -*(btScalar *)(local_10 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateJacobi(btRotationalLimitMotor2 * limot, const btTransform& transA,const btTransform& transB, btConstraintInfo2 *info, int srow, btVector3& ax1, int rotational, int rotAllowed)
{
	btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
	btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;

	J1[srow+0] = ax1[0];
	J1[srow+1] = ax1[1];
	J1[srow+2] = ax1[2];

	J2[srow+0] = -ax1[0];
	J2[srow+1] = -ax1[1];
	J2[srow+2] = -ax1[2];

	if(!rotational)
	{
		btVector3 tmpA, tmpB, relA, relB;
		// get vector from bodyB to frameB in WCS
		relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
		// same for bodyA
		relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
		tmpA = relA.cross(ax1);
		tmpB = relB.cross(ax1);
		if(m_hasStaticBody && (!rotAllowed))
		{
			tmpA *= m_factA;
			tmpB *= m_factB;
		}
		int i;
		for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
	}
}